

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O1

void __thiscall
BmsNoteLane::GetNoteExistBar
          (BmsNoteLane *this,set<int,_std::less<int>,_std::allocator<int>_> *barmap)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = *(_Rb_tree_node_base **)&this->field_0x18;
      p_Var1 != (_Rb_tree_node_base *)&this->field_0x8;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)barmap,
               (int *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void BmsNoteLane::GetNoteExistBar(std::set<barindex> &barmap) {
	for (Iterator i = Begin(); i != End(); ++i) {
		barmap.insert(i->first);
	}
}